

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu540c.c
# Opt level: O3

MPP_RET hal_jpege_v540c_deinit(void *hal)

{
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) enter\n","hal_jpege_v540c_deinit",0x6c);
  }
  jpege_bits_deinit(*(JpegeBits *)((long)hal + 0xe0));
  if (*(void **)((long)hal + 0x70) != (void *)0x0) {
    mpp_osal_free("hal_jpege_v540c_deinit",*(void **)((long)hal + 0x70));
  }
  *(undefined8 *)((long)hal + 0x70) = 0;
  if (*(void **)((long)hal + 0x78) != (void *)0x0) {
    mpp_osal_free("hal_jpege_v540c_deinit",*(void **)((long)hal + 0x78));
  }
  *(undefined8 *)((long)hal + 0x78) = 0;
  if (*(void **)((long)hal + 0xb8) != (void *)0x0) {
    mpp_osal_free("hal_jpege_v540c_deinit",*(void **)((long)hal + 0xb8));
  }
  *(undefined8 *)((long)hal + 0xb8) = 0;
  if (*(MppDev *)((long)hal + 0x68) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x68));
    *(undefined8 *)((long)hal + 0x68) = 0;
  }
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v540c","(%d) leave\n","hal_jpege_v540c_deinit",0x78);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_v540c_deinit(void *hal)
{
    jpegeV540cHalContext *ctx = (jpegeV540cHalContext *)hal;

    hal_jpege_enter();
    jpege_bits_deinit(ctx->bits);
    MPP_FREE(ctx->regs);

    MPP_FREE(ctx->reg_out);

    MPP_FREE(ctx->input_fmt);

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }
    hal_jpege_leave();
    return MPP_OK;
}